

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  SectionNode *pSVar1;
  TestCaseInfo *pTVar2;
  pointer pTVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  pointer pTVar6;
  pointer pTVar7;
  long *plVar8;
  ulong *puVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  string className;
  string local_b8;
  string local_98;
  SectionNode *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  pSVar1 = ((testCaseNode->children).
            super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
  pTVar2 = (testCaseNode->value).testInfo;
  pcVar13 = (pTVar2->className).m_start;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,pcVar13,pcVar13 + (pTVar2->className).m_size);
  if (local_98._M_string_length != 0) goto LAB_00158995;
  pTVar2 = (testCaseNode->value).testInfo;
  pTVar7 = (pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (pTVar2->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = (long)pTVar3 - (long)pTVar7;
  if (0 < (long)uVar12 >> 6) {
    pTVar6 = (pointer)((long)&(pTVar7->original).m_start + (uVar12 & 0xffffffffffffffc0));
    lVar10 = ((long)uVar12 >> 6) + 1;
    pTVar7 = pTVar7 + 2;
    do {
      if ((pTVar7[-2].original.m_size != 0) &&
         (pcVar13 = pTVar7[-2].original.m_start, *pcVar13 == '#')) {
        pTVar7 = pTVar7 + -2;
        goto LAB_001588f9;
      }
      if ((pTVar7[-1].original.m_size != 0) &&
         (pcVar13 = pTVar7[-1].original.m_start, *pcVar13 == '#')) {
        pTVar7 = pTVar7 + -1;
        goto LAB_001588f9;
      }
      if (((pTVar7->original).m_size != 0) &&
         (pcVar13 = (pTVar7->original).m_start, *pcVar13 == '#')) goto LAB_001588f9;
      if ((pTVar7[1].original.m_size != 0) &&
         (pcVar13 = pTVar7[1].original.m_start, *pcVar13 == '#')) {
        pTVar7 = pTVar7 + 1;
        goto LAB_001588f9;
      }
      lVar10 = lVar10 + -1;
      pTVar7 = pTVar7 + 4;
    } while (1 < lVar10);
    uVar12 = (long)pTVar3 - (long)pTVar6;
    pTVar7 = pTVar6;
  }
  lVar10 = (long)uVar12 >> 4;
  if (lVar10 == 1) {
LAB_001588d5:
    if (((pTVar7->original).m_size != 0) && (pcVar13 = (pTVar7->original).m_start, *pcVar13 == '#'))
    goto LAB_001588f9;
LAB_00158934:
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity =
         local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    if (lVar10 == 2) {
LAB_001588c2:
      if (((pTVar7->original).m_size == 0) ||
         (pcVar13 = (pTVar7->original).m_start, *pcVar13 != '#')) {
        pTVar7 = pTVar7 + 1;
        goto LAB_001588d5;
      }
    }
    else {
      if (lVar10 != 3) goto LAB_00158934;
      if (((pTVar7->original).m_size == 0) ||
         (pcVar13 = (pTVar7->original).m_start, *pcVar13 != '#')) {
        pTVar7 = pTVar7 + 1;
        goto LAB_001588c2;
      }
    }
LAB_001588f9:
    if (pTVar7 == pTVar3) goto LAB_00158934;
    uVar12 = (pTVar7->original).m_size;
    pcVar11 = "";
    if (1 < uVar12) {
      pcVar11 = pcVar13 + 1;
    }
    lVar10 = 0;
    if (uVar12 != 0) {
      lVar10 = uVar12 - 1;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar11,pcVar11 + lVar10);
  }
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x180d78);
  }
LAB_00158995:
  (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config)->
    _vptr_IConfig[3])();
  local_78 = pSVar1;
  if (extraout_RDX != 0) {
    iVar4 = (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config
              )->_vptr_IConfig[3])();
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,CONCAT44(extraout_var,iVar4),
               extraout_RDX_00 + CONCAT44(extraout_var,iVar4));
    plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_98._M_dataplus._M_p);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_b8.field_2._M_allocated_capacity = *puVar9;
      local_b8.field_2._8_8_ = plVar5[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar9;
      local_b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b8._M_string_length = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  uVar12 = std::__cxx11::string::find((char *)&local_98,0x17a889,0);
  if (uVar12 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)&local_98,uVar12,(char *)0x2,0x180e56);
      uVar12 = std::__cxx11::string::find((char *)&local_98,0x17a889,uVar12 + 1);
    } while (uVar12 != 0xffffffffffffffff);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  writeSection(this,&local_98,&local_b8,local_78,
               (((testCaseNode->value).testInfo)->properties & (MayFail|ShouldFail)) != None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JunitReporter::writeTestCase( TestCaseNode const& testCaseNode ) {
        TestCaseStats const& stats = testCaseNode.value;

        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert( testCaseNode.children.size() == 1 );
        SectionNode const& rootSection = *testCaseNode.children.front();

        std::string className =
            static_cast<std::string>( stats.testInfo->className );

        if( className.empty() ) {
            className = fileNameTag(stats.testInfo->tags);
            if ( className.empty() ) {
                className = "global";
            }
        }

        if ( !m_config->name().empty() )
            className = static_cast<std::string>(m_config->name()) + '.' + className;

        normalizeNamespaceMarkers(className);

        writeSection( className, "", rootSection, stats.testInfo->okToFail() );
    }